

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3TermSelect(Fts3Table *p,Fts3PhraseToken *pTok,int iColumn,int *pnOut,char **ppOut)

{
  Fts3MultiSegReader *pCsr;
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  int nOut;
  char *pcVar4;
  char *pcVar5;
  size_t __n;
  long in_FS_OFFSET;
  bool bVar6;
  bool bVar7;
  char *aNew;
  int nNew;
  TermSelect tsc;
  int local_154;
  undefined1 local_128 [12];
  int iStack_11c;
  undefined1 *local_118;
  char *local_108;
  int local_fc;
  char *local_f8 [16];
  int local_78 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_f8,0xaa,0xc0);
  local_118 = &DAT_aaaaaaaaaaaaaaaa;
  local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xfffffffffffffee0 = &DAT_aaaaaaaaaaaaaaaa;
  pCsr = pTok->pSegcsr;
  memset(local_f8,0,0xc0);
  local_118 = (undefined1 *)
              CONCAT44(local_118._4_4_,
                       (uint)(pTok->bFirst != 0) * 0x20 + (uint)(pTok->isPrefix != 0) * 8 + 3 +
                       (uint)(iColumn < p->nColumn) * 4);
  local_128._0_8_ = pTok->z;
  local_128._8_4_ = pTok->n;
  iStack_11c = iColumn;
  pCsr->pFilter = (Fts3SegFilter *)local_128;
  iVar1 = fts3SegReaderStart(p,pCsr,(char *)local_128._0_8_,local_128._8_4_);
  while ((iVar1 == 0 && (iVar1 = sqlite3Fts3SegReaderStep(p,pCsr), iVar1 == 100))) {
    pcVar5 = pCsr->aDoclist;
    iVar1 = pCsr->nDoclist;
    if (local_f8[0] == (char *)0x0) {
      __n = (size_t)iVar1;
      iVar2 = sqlite3_initialize();
      if (iVar2 == 0) {
        local_f8[0] = (char *)sqlite3Malloc(__n + 0xb);
      }
      else {
        local_f8[0] = (char *)0x0;
      }
      local_78[0] = iVar1;
      if (local_f8[0] != (char *)0x0) {
        memcpy(local_f8[0],pcVar5,__n);
        pcVar5 = local_f8[0] + __n;
        pcVar5[0] = '\0';
        pcVar5[1] = '\0';
        pcVar5[2] = '\0';
        pcVar5[3] = '\0';
        pcVar5[4] = '\0';
        pcVar5[5] = '\0';
        pcVar5[6] = '\0';
        pcVar5[7] = '\0';
        (local_f8[0] + __n + 8)[0] = '\0';
        (local_f8[0] + __n + 8)[1] = '\0';
        goto LAB_001ccbfa;
      }
      iVar1 = 7;
    }
    else {
      pcVar4 = pcVar5;
      lVar3 = 0;
      while (local_f8[lVar3] != (char *)0x0) {
        local_108 = &DAT_aaaaaaaaaaaaaaaa;
        local_fc = -0x55555556;
        iVar2 = fts3DoclistOrMerge((uint)p->bDescIdx,pcVar4,iVar1,local_f8[lVar3],local_78[lVar3],
                                   &local_108,&local_fc);
        bVar6 = iVar2 == 0;
        if (bVar6) {
          if (pcVar4 != pcVar5) {
            sqlite3_free(pcVar4);
          }
          sqlite3_free(local_f8[lVar3]);
          local_f8[lVar3] = (char *)0x0;
          pcVar4 = local_108;
          iVar1 = local_fc;
          if (lVar3 == 0xf) {
            local_f8[0xf] = local_108;
            local_78[0xf] = local_fc;
          }
        }
        else {
          local_154 = iVar2;
          if (pcVar4 != pcVar5) {
            sqlite3_free(pcVar4);
          }
        }
        if ((iVar2 != 0) || (bVar7 = lVar3 == 0xf, lVar3 = lVar3 + 1, bVar7)) goto LAB_001ccbac;
      }
      local_f8[lVar3] = pcVar4;
      local_78[lVar3] = iVar1;
      bVar6 = true;
LAB_001ccbac:
      iVar1 = local_154;
      if (bVar6) {
LAB_001ccbfa:
        iVar1 = 0;
      }
    }
  }
  if (iVar1 == 0) {
    lVar3 = 0;
    iVar1 = 0;
    pcVar5 = (char *)0x0;
    do {
      pcVar4 = local_f8[lVar3];
      if (pcVar4 != (char *)0x0) {
        if (pcVar5 == (char *)0x0) {
          iVar1 = local_78[lVar3];
          local_f8[lVar3] = (char *)0x0;
          pcVar5 = pcVar4;
        }
        else {
          local_fc = -0x55555556;
          local_108 = &DAT_aaaaaaaaaaaaaaaa;
          iVar1 = fts3DoclistOrMerge((uint)p->bDescIdx,pcVar4,local_78[lVar3],pcVar5,iVar1,
                                     &local_108,&local_fc);
          if (iVar1 != 0) {
            sqlite3_free(pcVar5);
            goto LAB_001cccf7;
          }
          sqlite3_free(local_f8[lVar3]);
          sqlite3_free(pcVar5);
          local_f8[lVar3] = (char *)0x0;
          pcVar5 = local_108;
          iVar1 = local_fc;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    local_f8[0] = pcVar5;
    local_78[0] = iVar1;
    iVar1 = 0;
  }
LAB_001cccf7:
  if (iVar1 == 0) {
    *ppOut = local_f8[0];
    *pnOut = local_78[0];
  }
  else {
    lVar3 = 0;
    do {
      sqlite3_free(local_f8[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
  }
  sqlite3Fts3SegReaderFinish(pCsr);
  sqlite3_free(pCsr);
  pTok->pSegcsr = (Fts3MultiSegReader *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3TermSelect(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3PhraseToken *pTok,          /* Token to query for */
  int iColumn,                    /* Column to query (or -ve for all columns) */
  int *pnOut,                     /* OUT: Size of buffer at *ppOut */
  char **ppOut                    /* OUT: Malloced result buffer */
){
  int rc;                         /* Return code */
  Fts3MultiSegReader *pSegcsr;    /* Seg-reader cursor for this term */
  TermSelect tsc;                 /* Object for pair-wise doclist merging */
  Fts3SegFilter filter;           /* Segment term filter configuration */

  pSegcsr = pTok->pSegcsr;
  memset(&tsc, 0, sizeof(TermSelect));

  filter.flags = FTS3_SEGMENT_IGNORE_EMPTY | FTS3_SEGMENT_REQUIRE_POS
        | (pTok->isPrefix ? FTS3_SEGMENT_PREFIX : 0)
        | (pTok->bFirst ? FTS3_SEGMENT_FIRST : 0)
        | (iColumn<p->nColumn ? FTS3_SEGMENT_COLUMN_FILTER : 0);
  filter.iCol = iColumn;
  filter.zTerm = pTok->z;
  filter.nTerm = pTok->n;

  rc = sqlite3Fts3SegReaderStart(p, pSegcsr, &filter);
  while( SQLITE_OK==rc
      && SQLITE_ROW==(rc = sqlite3Fts3SegReaderStep(p, pSegcsr))
  ){
    rc = fts3TermSelectMerge(p, &tsc, pSegcsr->aDoclist, pSegcsr->nDoclist);
  }

  if( rc==SQLITE_OK ){
    rc = fts3TermSelectFinishMerge(p, &tsc);
  }
  if( rc==SQLITE_OK ){
    *ppOut = tsc.aaOutput[0];
    *pnOut = tsc.anOutput[0];
  }else{
    int i;
    for(i=0; i<SizeofArray(tsc.aaOutput); i++){
      sqlite3_free(tsc.aaOutput[i]);
    }
  }

  fts3SegReaderCursorFree(pSegcsr);
  pTok->pSegcsr = 0;
  return rc;
}